

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O1

void __thiscall DIS::SeesPdu::unmarshal(SeesPdu *this,DataStream *dataStream)

{
  unsigned_short *d;
  unsigned_short *d_00;
  pointer pPVar1;
  pointer pPVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pPVar6;
  ulong uVar7;
  PropulsionSystemData x;
  PropulsionSystemData local_40;
  
  DistributedEmissionsFamilyPdu::unmarshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_orginatingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_infraredSignatureRepresentationIndex);
  DataStream::operator>>(dataStream,&this->_acousticSignatureRepresentationIndex);
  DataStream::operator>>(dataStream,&this->_radarCrossSectionSignatureRepresentationIndex);
  d = &this->_numberOfPropulsionSystems;
  DataStream::operator>>(dataStream,d);
  d_00 = &this->_numberOfVectoringNozzleSystems;
  DataStream::operator>>(dataStream,d_00);
  pPVar1 = (this->_propulsionSystemData).
           super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->_propulsionSystemData).
           super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar6 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      (**pPVar6->_vptr_PropulsionSystemData)(pPVar6);
      pPVar6 = pPVar6 + 1;
    } while (pPVar6 != pPVar2);
    (this->_propulsionSystemData).
    super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  if (*d != 0) {
    uVar7 = 0;
    do {
      PropulsionSystemData::PropulsionSystemData(&local_40);
      PropulsionSystemData::unmarshal(&local_40,dataStream);
      std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::push_back
                (&this->_propulsionSystemData,&local_40);
      PropulsionSystemData::~PropulsionSystemData(&local_40);
      uVar7 = uVar7 + 1;
    } while (uVar7 < *d);
  }
  pVVar3 = (this->_vectoringSystemData).
           super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (this->_vectoringSystemData).
           super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar5 = pVVar3;
  if (pVVar4 != pVVar3) {
    do {
      (**pVVar5->_vptr_VectoringNozzleSystem)(pVVar5);
      pVVar5 = pVVar5 + 1;
    } while (pVVar5 != pVVar4);
    (this->_vectoringSystemData).
    super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar3;
  }
  if (*d_00 != 0) {
    uVar7 = 0;
    do {
      VectoringNozzleSystem::VectoringNozzleSystem((VectoringNozzleSystem *)&local_40);
      VectoringNozzleSystem::unmarshal((VectoringNozzleSystem *)&local_40,dataStream);
      std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::
      push_back(&this->_vectoringSystemData,(value_type *)&local_40);
      VectoringNozzleSystem::~VectoringNozzleSystem((VectoringNozzleSystem *)&local_40);
      uVar7 = uVar7 + 1;
    } while (uVar7 < *d_00);
  }
  return;
}

Assistant:

void SeesPdu::unmarshal(DataStream& dataStream)
{
    DistributedEmissionsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _orginatingEntityID.unmarshal(dataStream);
    dataStream >> _infraredSignatureRepresentationIndex;
    dataStream >> _acousticSignatureRepresentationIndex;
    dataStream >> _radarCrossSectionSignatureRepresentationIndex;
    dataStream >> _numberOfPropulsionSystems;
    dataStream >> _numberOfVectoringNozzleSystems;

     _propulsionSystemData.clear();
     for(size_t idx = 0; idx < _numberOfPropulsionSystems; idx++)
     {
        PropulsionSystemData x;
        x.unmarshal(dataStream);
        _propulsionSystemData.push_back(x);
     }

     _vectoringSystemData.clear();
     for(size_t idx = 0; idx < _numberOfVectoringNozzleSystems; idx++)
     {
        VectoringNozzleSystem x;
        x.unmarshal(dataStream);
        _vectoringSystemData.push_back(x);
     }
}